

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::lazyPrintRunInfo(ConsoleReporter *this)

{
  StringRef str;
  ostream *poVar1;
  ColourGuard *this_00;
  long in_RDI;
  Version *in_stack_ffffffffffffff58;
  ostream *in_stack_ffffffffffffff60;
  ColourImpl *in_stack_ffffffffffffff68;
  size_type in_stack_ffffffffffffff70;
  lineOfChars local_9 [9];
  
  std::operator<<(*(ostream **)(in_RDI + 0x20),'\n');
  lineOfChars::lineOfChars(local_9,'~');
  poVar1 = Catch::operator<<((ostream *)in_stack_ffffffffffffff58,
                             (lineOfChars)(char)((ulong)in_stack_ffffffffffffff60 >> 0x38));
  std::operator<<(poVar1,'\n');
  Detail::unique_ptr<Catch::ColourImpl>::operator->
            ((unique_ptr<Catch::ColourImpl> *)(in_RDI + 0x28));
  ColourImpl::guardColour
            (in_stack_ffffffffffffff68,(Code)((ulong)in_stack_ffffffffffffff60 >> 0x20));
  Catch::operator<<(in_stack_ffffffffffffff60,(ColourGuard *)in_stack_ffffffffffffff58);
  str.m_size = in_stack_ffffffffffffff70;
  str.m_start = (char *)in_stack_ffffffffffffff68;
  poVar1 = Catch::operator<<(in_stack_ffffffffffffff60,str);
  std::operator<<(poVar1," is a Catch2 v");
  libraryVersion();
  poVar1 = Catch::operator<<(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  this_00 = (ColourGuard *)std::operator<<(poVar1," host application.\n");
  std::operator<<((ostream *)this_00,"Run with -? for options\n\n");
  ColourImpl::ColourGuard::~ColourGuard(this_00);
  *(undefined1 *)(in_RDI + 0x99) = 1;
  return;
}

Assistant:

void ConsoleReporter::lazyPrintRunInfo() {
    m_stream << '\n'
             << lineOfChars( '~' ) << '\n'
             << m_colour->guardColour( Colour::SecondaryText )
             << currentTestRunInfo.name << " is a Catch2 v" << libraryVersion()
             << " host application.\n"
             << "Run with -? for options\n\n";

    m_testRunInfoPrinted = true;
}